

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O2

IVec3 __thiscall
tcu::anon_unknown_3::convertRGB8ToNativeFormat
          (anon_unknown_3 *this,RGBA *color,RasterizationArguments *args)

{
  uint uVar1;
  int *piVar2;
  int channelNdx;
  long lVar3;
  uint uVar4;
  uint uVar5;
  char cVar6;
  IVec3 IVar7;
  
  Vector<int,_3>::Vector((Vector<int,_3> *)this);
  uVar1 = color->m_value;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    piVar2 = &args->redBits;
    uVar4 = uVar1;
    if (((int)lVar3 != 0) && (piVar2 = &args->greenBits, uVar4 = uVar1 >> 8, (int)lVar3 != 1)) {
      piVar2 = &args->blueBits;
      uVar4 = uVar1 >> 0x10;
    }
    cVar6 = (char)*piVar2;
    uVar5 = (uVar4 & 0xff) << (cVar6 - 8U & 0x1f);
    if (*piVar2 < 9) {
      uVar5 = (uVar4 & 0xff) >> (8U - cVar6 & 0x1f);
    }
    *(uint *)(this + lVar3 * 4) = uVar5;
  }
  IVar7.m_data[2] = uVar1;
  IVar7.m_data._0_8_ = this;
  return (IVec3)IVar7.m_data;
}

Assistant:

tcu::IVec3 convertRGB8ToNativeFormat (const tcu::RGBA& color, const RasterizationArguments& args)
{
	tcu::IVec3 pixelNativeColor;

	for (int channelNdx = 0; channelNdx < 3; ++channelNdx)
	{
		const int channelBitCount	= (channelNdx == 0) ? (args.redBits) : (channelNdx == 1) ? (args.greenBits) : (args.blueBits);
		const int channelPixelValue	= (channelNdx == 0) ? (color.getRed()) : (channelNdx == 1) ? (color.getGreen()) : (color.getBlue());

		if (channelBitCount <= 8)
			pixelNativeColor[channelNdx] = channelPixelValue >> (8 - channelBitCount);
		else if (channelBitCount == 8)
			pixelNativeColor[channelNdx] = channelPixelValue;
		else
		{
			// just in case someone comes up with 8+ bits framebuffers pixel formats. But as
			// we can only read in rgba8, we have to guess the trailing bits. Guessing 0.
			pixelNativeColor[channelNdx] = channelPixelValue << (channelBitCount - 8);
		}
	}

	return pixelNativeColor;
}